

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O2

int csp_conn_enqueue_packet(csp_conn_t *conn,csp_packet_t *packet)

{
  int iVar1;
  int iVar2;
  csp_packet_t *packet_local;
  
  if (conn == (csp_conn_t *)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = 0;
    packet_local = packet;
    iVar1 = csp_queue_enqueue(conn->rx_queue,&packet_local,0);
    if (iVar1 != 0) {
      csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int csp_conn_enqueue_packet(csp_conn_t * conn, csp_packet_t * packet) {

	if (!conn)
		return CSP_ERR_INVAL;

	if (csp_queue_enqueue(conn->rx_queue, &packet, 0) != CSP_QUEUE_OK) {
		csp_dbg_conn_ovf++;
		return CSP_ERR_NOMEM;
	}

	return CSP_ERR_NONE;
}